

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O0

bool IntToMinMaxCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  anon_class_16_2_ee34707b fun;
  int32_t iVar1;
  int32_t iVar2;
  LogicalType *pLVar3;
  int32_t *in_RCX;
  Vector *in_RSI;
  int32_t max_val;
  int32_t min_val;
  LogicalType *ty;
  FunctionErrors in_stack_ffffffffffffffbf;
  LogicalType *in_stack_ffffffffffffffc0;
  
  pLVar3 = duckdb::Vector::GetType(in_RSI);
  iVar1 = MinMaxType::GetMinValue(in_stack_ffffffffffffffc0);
  iVar2 = MinMaxType::GetMaxValue(in_stack_ffffffffffffffc0);
  fun.max_val = in_RCX;
  fun.min_val = (int32_t *)pLVar3;
  duckdb::UnaryExecutor::
  Execute<int,int,IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0>
            ((Vector *)CONCAT44(iVar1,iVar2),(Vector *)&stack0xffffffffffffffd0,
             (idx_t)&stack0xffffffffffffffd4,fun,in_stack_ffffffffffffffbf);
  return true;
}

Assistant:

static bool IntToMinMaxCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &ty = result.GetType();
	auto min_val = MinMaxType::GetMinValue(ty);
	auto max_val = MinMaxType::GetMaxValue(ty);
	UnaryExecutor::Execute<int32_t, int32_t>(source, result, count, [&](int32_t input) {
		if (input < min_val || input > max_val) {
			throw ConversionException(StringUtil::Format("Value %s is outside of range [%s,%s]", to_string(input),
			                                             to_string(min_val), to_string(max_val)));
		}
		return input;
	});
	return true;
}